

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irStatement *
new_ir_move(Context_conflict *ctx,MOJOSHADER_irExpression *dst,MOJOSHADER_irExpression *src,
           int writemask)

{
  MOJOSHADER_irMove *retval;
  int writemask_local;
  MOJOSHADER_irExpression *src_local;
  MOJOSHADER_irExpression *dst_local;
  Context_conflict *ctx_local;
  
  ctx_local = (Context_conflict *)Malloc(ctx,0x30);
  if (ctx_local == (Context_conflict *)0x0) {
    ctx_local = (Context_conflict *)0x0;
  }
  else {
    ctx_local->isfail = 0xd;
    ctx_local->malloc = (MOJOSHADER_malloc)ctx->sourcefile;
    *(uint *)&ctx_local->free = ctx->sourceline;
    if (((dst == (MOJOSHADER_irExpression *)0x0) || (src == (MOJOSHADER_irExpression *)0x0)) ||
       ((dst->info).type != (src->info).type)) {
      __assert_fail("dst && src && (dst->info.type == src->info.type)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x12b4,
                    "MOJOSHADER_irStatement *new_ir_move(Context *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, const int)"
                   );
    }
    if (((dst == (MOJOSHADER_irExpression *)0x0) || (src == (MOJOSHADER_irExpression *)0x0)) ||
       ((dst->info).elements != (src->info).elements)) {
      __assert_fail("dst && src && (dst->info.elements == src->info.elements)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x12b5,
                    "MOJOSHADER_irStatement *new_ir_move(Context *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, const int)"
                   );
    }
    ctx_local->malloc_data = dst;
    ctx_local->errors = (ErrorList *)src;
    *(int *)&ctx_local->warnings = writemask;
  }
  return (MOJOSHADER_irStatement *)ctx_local;
}

Assistant:

static MOJOSHADER_irStatement *new_ir_move(Context *ctx,
                                      MOJOSHADER_irExpression *dst,
                                      MOJOSHADER_irExpression *src,
                                      const int writemask)
{
    NEW_IR_NODE(retval, MOJOSHADER_irMove, MOJOSHADER_IR_MOVE);
    assert(dst && src && (dst->info.type == src->info.type));
    assert(dst && src && (dst->info.elements == src->info.elements));
    retval->dst = dst;
    retval->src = src;
    retval->writemask = writemask;
    return (MOJOSHADER_irStatement *) retval;
}